

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqvm.cpp
# Opt level: O0

bool __thiscall
SQVM::StartCall<true>
          (SQVM *this,SQClosure *closure,SQInteger target,SQInteger args,SQInteger stackbase,
          bool tailcall)

{
  ulong uVar1;
  byte bVar2;
  bool bVar3;
  uint uVar4;
  long lVar5;
  SQArray *pSVar6;
  ulong in_RCX;
  SQInt32 in_EDX;
  long in_RSI;
  SQVM *in_RDI;
  SQVM *in_R8;
  byte in_R9B;
  SQObjectPtr temp;
  SQGenerator *gen;
  SQFunctionProto *f;
  SQInteger n_1;
  SQInteger diff;
  SQInteger ndef;
  SQInteger n;
  SQInteger pbase;
  SQArray *arr;
  SQInteger nvargs;
  SQInteger nargs;
  SQInteger newtop;
  SQInteger paramssize;
  SQFunctionProto *func;
  undefined4 in_stack_fffffffffffffec8;
  undefined4 in_stack_fffffffffffffecc;
  SQSharedState *in_stack_fffffffffffffed0;
  SQClosure *in_stack_fffffffffffffed8;
  SQGenerator *x;
  undefined4 in_stack_fffffffffffffee0;
  undefined4 in_stack_fffffffffffffee4;
  SQObjectPtr *in_stack_fffffffffffffee8;
  SQInteger in_stack_fffffffffffffef0;
  char *pcVar7;
  SQInteger in_stack_fffffffffffffef8;
  SQVM *in_stack_ffffffffffffff00;
  undefined4 in_stack_ffffffffffffff14;
  undefined1 tailcall_00;
  SQInteger in_stack_ffffffffffffff18;
  SQInteger in_stack_ffffffffffffff20;
  char *pcVar8;
  SQVM *in_stack_ffffffffffffff28;
  code *local_d0;
  undefined1 local_b0 [24];
  SQCollectable *target_00;
  SQVM *in_stack_ffffffffffffff70;
  SQSharedState *in_stack_ffffffffffffff78;
  SQObjectValue local_78;
  SQObjectValue forcedline;
  undefined7 in_stack_ffffffffffffffc8;
  bool local_1;
  
  tailcall_00 = (undefined1)((uint)in_stack_ffffffffffffff14 >> 0x18);
  bVar2 = in_R9B & 1;
  forcedline = (SQObjectValue)((SQObjectValue *)(in_RSI + 0x40))->pFunctionProto;
  uVar1 = (forcedline.pFunctionProto)->_nparameters;
  if (((forcedline.pGenerator)->_ci)._closure.super_SQObject._unVal.pTable == (SQTable *)0x0) {
    if (uVar1 != in_RCX) {
      lVar5 = (forcedline.pFunctionProto)->_ndefaultparams;
      if (((lVar5 == 0) || ((long)uVar1 <= (long)in_RCX)) ||
         (in_stack_ffffffffffffff78 = (SQSharedState *)(uVar1 - in_RCX),
         lVar5 < (long)in_stack_ffffffffffffff78)) {
        if (((forcedline.pOuter)->_value).super_SQObject._type == OT_STRING) {
          pcVar8 = (char *)((forcedline.pInstance)->_hook + 0x38);
        }
        else {
          pcVar8 = "unknown";
        }
        if (((forcedline.pGenerator)->_closure).super_SQObject._type == OT_STRING) {
          pcVar7 = (char *)&(forcedline.pClosure)->_base->_base;
        }
        else {
          pcVar7 = "unknown";
        }
        if ((forcedline.pFunctionProto)->_nlineinfos < 1) {
          uVar4 = 0;
        }
        else {
          uVar4 = *(uint *)(((forcedline.pGenerator)->_ci)._root + 4) & 0x7fffffff;
        }
        Raise_Error(in_RDI,
                    "wrong number of parameters passed to \'%s\' %s:%d (%d passed, %d required)",
                    pcVar8,pcVar7,(ulong)uVar4,in_RCX & 0xffffffff,(int)uVar1);
        return false;
      }
      for (in_stack_ffffffffffffff70 = (SQVM *)(lVar5 - (long)in_stack_ffffffffffffff78);
          tailcall_00 = (undefined1)((uint)in_stack_ffffffffffffff14 >> 0x18),
          (long)in_stack_ffffffffffffff70 < lVar5;
          in_stack_ffffffffffffff70 =
               (SQVM *)((long)&(in_stack_ffffffffffffff70->super_SQCollectable).super_SQRefCounted.
                               _vptr_SQRefCounted + 1)) {
        ::SQObjectPtr::operator=
                  ((SQObjectPtr *)CONCAT44(in_stack_fffffffffffffee4,in_stack_fffffffffffffee0),
                   (SQObjectPtr *)in_stack_fffffffffffffed8);
      }
    }
  }
  else {
    lVar5 = uVar1 - 1;
    if ((long)in_RCX < lVar5) {
      if (((forcedline.pOuter)->_value).super_SQObject._type == OT_STRING) {
        local_d0 = (forcedline.pInstance)->_hook + 0x38;
      }
      else {
        local_d0 = (code *)0x1e202c;
      }
      if (((forcedline.pGenerator)->_closure).super_SQObject._type == OT_STRING) {
        pcVar8 = (char *)&(forcedline.pClosure)->_base->_base;
      }
      else {
        pcVar8 = "unknown";
      }
      if ((forcedline.pFunctionProto)->_nlineinfos < 1) {
        uVar4 = 0;
      }
      else {
        uVar4 = *(uint *)(((forcedline.pGenerator)->_ci)._root + 4) & 0x7fffffff;
      }
      Raise_Error(in_RDI,
                  "wrong number of parameters passed to \'%s\' %s:%d (%d passed, at least %d required)"
                  ,local_d0,pcVar8,(ulong)uVar4,in_RCX & 0xffffffff,(int)lVar5);
      return false;
    }
    pSVar6 = SQArray::Create(in_stack_fffffffffffffed0,
                             CONCAT44(in_stack_fffffffffffffecc,in_stack_fffffffffffffec8));
    for (local_78.pTable = (SQTable *)0x0;
        tailcall_00 = (undefined1)((uint)in_stack_ffffffffffffff14 >> 0x18),
        local_78.nInteger < (long)(in_RCX - lVar5);
        local_78.pTable =
             (SQTable *)
             ((long)&((local_78.pTable)->super_SQDelegable).super_SQCollectable.super_SQRefCounted.
                     _vptr_SQRefCounted + 1)) {
      sqvector<SQObjectPtr,_unsigned_int>::operator[](&pSVar6->_values,(size_type)local_78.fFloat);
      ::SQObjectPtr::operator=
                ((SQObjectPtr *)CONCAT44(in_stack_fffffffffffffee4,in_stack_fffffffffffffee0),
                 (SQObjectPtr *)in_stack_fffffffffffffed8);
      ::SQObjectPtr::Null((SQObjectPtr *)
                          CONCAT44(in_stack_fffffffffffffee4,in_stack_fffffffffffffee0));
    }
    ::SQObjectPtr::operator=
              ((SQObjectPtr *)CONCAT44(in_stack_fffffffffffffee4,in_stack_fffffffffffffee0),
               (SQArray *)in_stack_fffffffffffffed8);
  }
  if (*(long *)(in_RSI + 0x30) != 0) {
    ::SQObjectPtr::operator=
              ((SQObjectPtr *)CONCAT44(in_stack_fffffffffffffee4,in_stack_fffffffffffffee0),
               (SQObject *)in_stack_fffffffffffffed8);
  }
  bVar3 = EnterFrame(in_stack_ffffffffffffff28,in_stack_ffffffffffffff20,in_stack_ffffffffffffff18,
                     (bool)tailcall_00);
  if (bVar3) {
    ::SQObjectPtr::operator=
              ((SQObjectPtr *)CONCAT44(in_stack_fffffffffffffee4,in_stack_fffffffffffffee0),
               in_stack_fffffffffffffed8);
    in_RDI->ci->_literals = (SQObjectPtr *)((forcedline.pGenerator)->_etraps)._alloc_ctx;
    in_RDI->ci->_ip = (forcedline.pFunctionProto)->_instructions;
    in_RDI->ci->_target = in_EDX;
    if ((in_RDI->_debughook & 1U) != 0) {
      CallDebugHook(in_R8,CONCAT17(bVar2,in_stack_ffffffffffffffc8),forcedline.nInteger);
    }
    if ((*(byte *)(*(long *)(in_RSI + 0x40) + 0x68) & 1) != 0) {
      target_00 = *(SQCollectable **)(in_RSI + 0x40);
      local_b0._16_8_ =
           SQGenerator::Create(in_stack_fffffffffffffed0,
                               (SQClosure *)
                               CONCAT44(in_stack_fffffffffffffecc,in_stack_fffffffffffffec8));
      bVar3 = SQGenerator::Yield((SQGenerator *)in_stack_ffffffffffffff78,in_stack_ffffffffffffff70,
                                 (SQInteger)target_00);
      if (!bVar3) {
        return false;
      }
      x = (SQGenerator *)local_b0;
      ::SQObjectPtr::SQObjectPtr((SQObjectPtr *)in_stack_fffffffffffffed0);
      Return<true>(in_stack_ffffffffffffff00,in_stack_fffffffffffffef8,in_stack_fffffffffffffef0,
                   in_stack_fffffffffffffee8);
      ::SQObjectPtr::operator=
                ((SQObjectPtr *)CONCAT44(in_stack_fffffffffffffee4,in_stack_fffffffffffffee0),x);
      ::SQObjectPtr::~SQObjectPtr((SQObjectPtr *)in_stack_fffffffffffffed0);
    }
    local_1 = true;
  }
  else {
    local_1 = false;
  }
  return local_1;
}

Assistant:

bool SQVM::StartCall(SQClosure *closure,SQInteger target,SQInteger args,SQInteger stackbase,bool tailcall)
{
    SQFunctionProto *func = closure->_function;

    SQInteger paramssize = func->_nparameters;
    const SQInteger newtop = stackbase + func->_stacksize;
    SQInteger nargs = args;
    if(func->_varparams)
    {
        paramssize--;
        if (nargs < paramssize) {
            Raise_Error(_SC("wrong number of parameters passed to '%s' %s:%d (%d passed, at least %d required)"),
              sq_type(func->_name) == OT_STRING ? _stringval(func->_name) : _SC("unknown"),
              sq_type(func->_sourcename) == OT_STRING ? _stringval(func->_sourcename) : _SC("unknown"),
              int(func->_nlineinfos > 0 ? func->_lineinfos[0]._line : 0),
              (int)nargs, (int)paramssize);
            return false;
        }

        //dumpstack(stackbase);
        SQInteger nvargs = nargs - paramssize;
        SQArray *arr = SQArray::Create(_ss(this),nvargs);
        SQInteger pbase = stackbase+paramssize;
        for(SQInteger n = 0; n < nvargs; n++) {
            arr->_values[n] = _stack._vals[pbase];
            _stack._vals[pbase].Null();
            pbase++;

        }
        _stack._vals[stackbase+paramssize] = arr;
        //dumpstack(stackbase);
    }
    else if (paramssize != nargs) {
        SQInteger ndef = func->_ndefaultparams;
        SQInteger diff;
        if(ndef && nargs < paramssize && (diff = paramssize - nargs) <= ndef) {
            for(SQInteger n = ndef - diff; n < ndef; n++) {
                _stack._vals[stackbase + (nargs++)] = closure->_defaultparams[n];
            }
        }
        else {
            Raise_Error(_SC("wrong number of parameters passed to '%s' %s:%d (%d passed, %d required)"),
              sq_type(func->_name) == OT_STRING ? _stringval(func->_name) : _SC("unknown"),
              sq_type(func->_sourcename) == OT_STRING ? _stringval(func->_sourcename) : _SC("unknown"),
              int(func->_nlineinfos > 0 ? func->_lineinfos[0]._line : 0),
              (int)nargs, (int)paramssize);
            return false;
        }
    }

    if(closure->_env) {
        _stack._vals[stackbase] = closure->_env->_obj;
    }

    if(!EnterFrame(stackbase, newtop, tailcall)) return false;

    ci->_closure  = closure;
    ci->_literals = func->_literals;
    ci->_ip       = func->_instructions;
    ci->_target   = (SQInt32)target;
    if constexpr (debughookPresent)
    {
        if (_debughook) {
            CallDebugHook(_SC('c'));
        }
    }

    if (closure->_function->_bgenerator) {
        SQFunctionProto *f = closure->_function;
        SQGenerator *gen = SQGenerator::Create(_ss(this), closure);
        if(!gen->Yield(this,f->_stacksize))
            return false;
        SQObjectPtr temp;
        Return<debughookPresent>(1, target, temp);
        STK(target) = gen;
    }


    return true;
}